

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadObject(CoronaLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *this_00;
  int iVar2;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  Ref<embree::XML> *in_RDX;
  CoronaLoader *this_01;
  FileName fileName;
  string local_70;
  string local_50;
  
  iVar2 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_50,&in_RDX->ptr->loc);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(prVar3,(string *)&local_70);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = in_RDX->ptr;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"class","");
  XML::parm(&local_70,this_00,&local_50);
  this_01 = (CoronaLoader *)0x259e60;
  iVar2 = std::__cxx11::string::compare((char *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (iVar2 == 0) {
    load<embree::FileName>((FileName *)&local_70,this_01,in_RDX);
    FileName::operator+((FileName *)&local_50,(FileName *)xml,(FileName *)&local_70);
    SceneGraph::load((SceneGraph *)this,(FileName *)&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_50,&in_RDX->ptr->loc);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_70);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadObject(const Ref<XML>& xml) 
  {
    if (xml->name != "object") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object node");
    if (xml->parm("class") != "file")
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object class");
    const FileName fileName = load<FileName>(xml);
    return SceneGraph::load(path+fileName);
  }